

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Prog * re2::Compiler::CompileSet(Options *options,Anchor anchor,Regexp *re)

{
  uint uVar1;
  Frag b;
  Frag FVar2;
  Prog *this;
  bool failed;
  Compiler local_b0;
  StringPiece sp;
  
  Compiler(&local_b0);
  uVar1 = RE2::Options::ParseFlags(options);
  local_b0.max_mem_ = options->max_mem_;
  (local_b0.prog_)->flags_ = uVar1;
  if ((uVar1 & 0x20) != 0) {
    local_b0.encoding_ = kEncodingLatin1;
  }
  if (local_b0.max_mem_ < 1) {
    local_b0.max_inst_ = 100000;
  }
  else {
    local_b0.max_inst_ = 0;
    if (0x1b8 < local_b0.max_mem_) {
      local_b0.max_inst_ = 0x1000000;
      if (local_b0.max_mem_ - 0x1b8U < 0x8000000) {
        local_b0.max_inst_ = (int)(local_b0.max_mem_ - 0x1b8U >> 3);
      }
    }
  }
  local_b0.super_Walker<re2::Frag>.max_visits_ = local_b0.max_inst_ * 2;
  local_b0.anchor_ = anchor;
  b = Regexp::Walker<re2::Frag>::WalkInternal(&local_b0.super_Walker<re2::Frag>,re,(Frag)0x0,false);
  Regexp::Decref(re);
  if (local_b0.failed_ == false) {
    if (anchor == UNANCHORED) {
      FVar2 = ByteRange(&local_b0,0,0xff,false);
      FVar2 = Star(&local_b0,FVar2,true);
      b = Cat(&local_b0,FVar2,b);
    }
    (local_b0.prog_)->start_ = b.begin;
    (local_b0.prog_)->start_unanchored_ = b.begin;
    (local_b0.prog_)->anchor_start_ = true;
    (local_b0.prog_)->anchor_end_ = true;
    this = Finish(&local_b0);
    if (this != (Prog *)0x0) {
      sp.ptr_ = "hello, world";
      sp.length_ = 0xc;
      Prog::SearchDFA(this,&sp,&sp,kAnchored,kManyMatch,(StringPiece *)0x0,&failed,
                      (vector<int,_std::allocator<int>_> *)0x0);
      if (failed != true) goto LAB_00125b86;
      Prog::~Prog(this);
      operator_delete(this);
    }
  }
  this = (Prog *)0x0;
LAB_00125b86:
  ~Compiler(&local_b0);
  return this;
}

Assistant:

Prog* Compiler::CompileSet(const RE2::Options& options, RE2::Anchor anchor,
                           Regexp* re) {
  Compiler c;

  Regexp::ParseFlags pf = static_cast<Regexp::ParseFlags>(options.ParseFlags());
  c.Setup(pf, options.max_mem(), anchor);

  // Compile alternation of fragments.
  Frag all = c.WalkExponential(re, Frag(), 2*c.max_inst_);
  re->Decref();
  if (c.failed_)
    return NULL;

  if (anchor == RE2::UNANCHORED) {
    // The trailing .* was added while handling kRegexpHaveMatch.
    // We just have to add the leading one.
    all = c.Cat(c.DotStar(), all);
  }

  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);
  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  Prog* prog = c.Finish();
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool failed;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &failed, NULL);
  if (failed) {
    delete prog;
    return NULL;
  }

  return prog;
}